

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3.h
# Opt level: O1

string * __thiscall
mnf::SO3<mnf::ExpMapQuaternion>::toString
          (string *__return_storage_ptr__,SO3<mnf::ExpMapQuaternion> *this,ConstRefVec *val,
          string *prefix,IOFormat *fmt)

{
  pointer pcVar1;
  PointerType ptr;
  ostream *s;
  string matPrefix;
  stringstream ss;
  char *local_2f8;
  ulong local_2f0;
  char local_2e8 [16];
  PointerType local_2d8;
  IOFormat local_2c8;
  Matrix<double,_4,_1,_0,_4,_1> local_1d8;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f8,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_2f8,local_2f0,0,'\x01');
  std::__cxx11::stringstream::stringstream(local_1b0);
  s = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,local_2f8,local_2f0);
  local_2d8 = (val->
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ).
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_data;
  Eigen::IOFormat::IOFormat(&local_2c8,fmt);
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       *local_2d8;
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       local_2d8[1];
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       local_2d8[2];
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       local_2d8[3];
  Eigen::internal::print_matrix<Eigen::Matrix<double,4,1,0,4,1>>(s,&local_1d8,&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.coeffSeparator._M_dataplus._M_p != &local_2c8.coeffSeparator.field_2) {
    operator_delete(local_2c8.coeffSeparator._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.rowSpacer._M_dataplus._M_p != &local_2c8.rowSpacer.field_2) {
    operator_delete(local_2c8.rowSpacer._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.rowSeparator._M_dataplus._M_p != &local_2c8.rowSeparator.field_2) {
    operator_delete(local_2c8.rowSeparator._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.rowSuffix._M_dataplus._M_p != &local_2c8.rowSuffix.field_2) {
    operator_delete(local_2c8.rowSuffix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.rowPrefix._M_dataplus._M_p != &local_2c8.rowPrefix.field_2) {
    operator_delete(local_2c8.rowPrefix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.matSuffix._M_dataplus._M_p != &local_2c8.matSuffix.field_2) {
    operator_delete(local_2c8.matSuffix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.matPrefix._M_dataplus._M_p != &local_2c8.matPrefix.field_2) {
    operator_delete(local_2c8.matPrefix._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string SO3<Map>::toString(const ConstRefVec& val,
                                      const std::string& prefix,
                                      const Eigen::IOFormat& fmt) const
{
  std::string matPrefix = prefix + '[';
  std::stringstream ss;
  ss << matPrefix
     << (Eigen::Map<const typename Map::DisplayType>(val.data())).format(fmt);
  return ss.str();
}